

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalGhsMultiGenerator.cxx
# Opt level: O2

string * __thiscall
cmLocalGhsMultiGenerator::GetTargetDirectory_abi_cxx11_
          (string *__return_storage_ptr__,cmLocalGhsMultiGenerator *this,cmGeneratorTarget *target)

{
  string *psVar1;
  cmAlphaNum local_68;
  cmAlphaNum local_38;
  
  psVar1 = cmGeneratorTarget::GetName_abi_cxx11_(target);
  local_38.View_._M_str = (psVar1->_M_dataplus)._M_p;
  local_38.View_._M_len = psVar1->_M_string_length;
  local_68.View_._M_len = 4;
  local_68.View_._M_str = ".dir";
  cmStrCat<>(__return_storage_ptr__,&local_38,&local_68);
  return __return_storage_ptr__;
}

Assistant:

std::string cmLocalGhsMultiGenerator::GetTargetDirectory(
  cmGeneratorTarget const* target) const
{
  std::string dir = cmStrCat(target->GetName(), ".dir");
  return dir;
}